

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

void __thiscall QPainterPath::addPath(QPainterPath *this,QPainterPath *other)

{
  bool bVar1;
  int iVar2;
  QPainterPathPrivate *pQVar3;
  Element *pEVar4;
  qsizetype qVar5;
  QList<QPainterPath::Element> *l;
  QPainterPathPrivate *pQVar6;
  int cStart;
  QPainterPathPrivate *d;
  QList<QPainterPath::Element> *in_stack_ffffffffffffffc8;
  QList<QPainterPath::Element> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  bVar1 = isEmpty((QPainterPath *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (!bVar1) {
    ensureData((QPainterPath *)in_stack_ffffffffffffffd0);
    detach((QPainterPath *)in_stack_ffffffffffffffd0);
    pQVar3 = d_func((QPainterPath *)0x5b881f);
    pEVar4 = QList<QPainterPath::Element>::constLast(in_stack_ffffffffffffffc8);
    if (pEVar4->type == MoveToElement) {
      in_stack_ffffffffffffffd0 = &pQVar3->elements;
      qVar5 = QList<QPainterPath::Element>::size(&pQVar3->elements);
      QList<QPainterPath::Element>::remove(in_stack_ffffffffffffffd0,(char *)(qVar5 + -1));
    }
    l = (QList<QPainterPath::Element> *)QList<QPainterPath::Element>::size(&pQVar3->elements);
    pQVar6 = d_func((QPainterPath *)0x5b8886);
    iVar2 = (int)l + pQVar6->cStart;
    d_func((QPainterPath *)0x5b88a5);
    QList<QPainterPath::Element>::operator+=(in_stack_ffffffffffffffd0,l);
    pQVar3->cStart = iVar2;
    d_func((QPainterPath *)0x5b88d3);
    bVar1 = QPainterPathPrivate::isClosed
                      ((QPainterPathPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    pQVar3->field_0x84 = pQVar3->field_0x84 & 0xfe | bVar1;
  }
  return;
}

Assistant:

void QPainterPath::addPath(const QPainterPath &other)
{
    if (other.isEmpty())
        return;

    ensureData();
    detach();

    QPainterPathPrivate *d = d_func();
    // Remove last moveto so we don't get multiple moveto's
    if (d->elements.constLast().type == MoveToElement)
        d->elements.remove(d->elements.size()-1);

    // Locate where our own current subpath will start after the other path is added.
    int cStart = d->elements.size() + other.d_func()->cStart;
    d->elements += other.d_func()->elements;
    d->cStart = cStart;

    d->require_moveTo = other.d_func()->isClosed();
}